

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductData.hpp
# Opt level: O0

void __thiscall OpticsParser::ProductData::ProductData(ProductData *this)

{
  ProductData *this_local;
  
  std::enable_shared_from_this<OpticsParser::ProductData>::enable_shared_from_this
            (&this->super_enable_shared_from_this<OpticsParser::ProductData>);
  this->_vptr_ProductData = (_func_int **)&PTR__ProductData_002cb350;
  std::__cxx11::string::string((string *)&this->name);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->productName);
  std::__cxx11::string::string((string *)&this->productType);
  std::__cxx11::string::string((string *)&this->manufacturer);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->productSubtype);
  std::optional<int>::optional(&this->nfrcid);
  std::optional<int>::optional(&this->cgdbShadingLayerId);
  std::optional<int>::optional(&this->cgdbShadeMaterialId);
  std::optional<double>::optional(&this->thickness);
  std::optional<double>::optional(&this->conductivity);
  std::optional<double>::optional(&this->IRTransmittance);
  std::optional<double>::optional(&this->frontEmissivity);
  std::optional<double>::optional(&this->backEmissivity);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->frontEmissivitySource);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->backEmissivitySource);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->material);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->coatingName);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->coatedSide);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->substrateFilename);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->appearance);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->acceptance);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->fileName);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->unitSystem);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->wavelengthUnit);
  std::
  optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
  ::optional(&this->measurements);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->extrapolation);
  std::optional<int>::optional(&this->aercID);
  std::optional<bool>::optional(&this->specularity);
  std::optional<double>::optional(&this->permeabilityFactor);
  std::optional<int>::optional(&this->igdbChecksum);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->igdbDatabaseVersion);
  std::optional<int>::optional(&this->cgdbChecksum);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->cgdbDatabaseVersion);
  std::optional<double>::optional(&this->density);
  std::optional<double>::optional(&this->youngsModulus);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->dataFileName);
  std::optional<double>::optional(&this->opticalOpenness);
  std::optional<OpticsParser::DualBandValues>::optional(&this->dualBandSpecular);
  std::optional<OpticsParser::DualBandValues>::optional(&this->dualBandDiffuse);
  std::optional<OpticsParser::PrecalculatedResults>::optional(&this->precalculatedResults);
  std::
  optional<std::map<double,_std::vector<OpticsParser::PVPowerProperty,_std::allocator<OpticsParser::PVPowerProperty>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<OpticsParser::PVPowerProperty,_std::allocator<OpticsParser::PVPowerProperty>_>_>_>_>_>
  ::optional(&this->pvPowerProperties);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->thicknessUnit);
  std::shared_ptr<OpticsParser::ProductData>::shared_ptr(&this->materialDefinition,(nullptr_t)0x0);
  std::shared_ptr<OpticsParser::ProductGeometry>::shared_ptr(&this->geometry,(nullptr_t)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->deviceType);
  return;
}

Assistant:

virtual ~ProductData() = default;